

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structs.c
# Opt level: O0

ulp_ciphertext * ulp_alloc_ciphertext(size_t n,size_t l)

{
  uint64_t *puVar1;
  size_t in_RSI;
  size_t in_RDI;
  ulp_ciphertext *ciphertext;
  ulp_ciphertext *local_8;
  
  local_8 = (ulp_ciphertext *)malloc(0x20);
  if (local_8 == (ulp_ciphertext *)0x0) {
    local_8 = (ulp_ciphertext *)0x0;
  }
  else {
    local_8->n = in_RDI;
    local_8->l = in_RSI;
    puVar1 = (uint64_t *)malloc(in_RDI << 3);
    local_8->c1 = puVar1;
    puVar1 = (uint64_t *)malloc(in_RSI << 3);
    local_8->c2 = puVar1;
    if ((local_8->c1 == (uint64_t *)0x0) || (local_8->c2 == (uint64_t *)0x0)) {
      free(local_8->c1);
      free(local_8->c2);
      free(local_8);
      local_8 = (ulp_ciphertext *)0x0;
    }
  }
  return local_8;
}

Assistant:

ulp_ciphertext* ulp_alloc_ciphertext(size_t n, size_t l) {
    ulp_ciphertext* ciphertext = malloc(sizeof(ulp_ciphertext));
    if(ciphertext == NULL)
        return NULL;
    ciphertext->n = n;
    ciphertext->l = l;
    ciphertext->c1 = malloc(n*sizeof(uint64_t));
    ciphertext->c2 = malloc(l*sizeof(uint64_t));
    if(ciphertext->c1 == NULL || ciphertext->c2 == NULL) {
        free(ciphertext->c1);
        free(ciphertext->c2);
        free(ciphertext);
        return NULL;
    }
    return ciphertext;
}